

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bellman_ford.h
# Opt level: O3

bool __thiscall
lemon::
BellmanFord<lemon::ReverseDigraph<const_lemon::SmartDigraph>,_lemon::DigraphExtender<lemon::SmartDigraphBase>::ArcMap<double>,_lemon::BellmanFordDefaultTraits<lemon::ReverseDigraph<const_lemon::SmartDigraph>,_lemon::DigraphExtender<lemon::SmartDigraphBase>::ArcMap<double>_>_>
::processNextRound(BellmanFord<lemon::ReverseDigraph<const_lemon::SmartDigraph>,_lemon::DigraphExtender<lemon::SmartDigraphBase>::ArcMap<double>,_lemon::BellmanFordDefaultTraits<lemon::ReverseDigraph<const_lemon::SmartDigraph>,_lemon::DigraphExtender<lemon::SmartDigraphBase>::ArcMap<double>_>_>
                   *this)

{
  ulong *puVar1;
  _Bit_type *p_Var2;
  pointer pdVar3;
  Digraph *pDVar4;
  ulong uVar5;
  pointer pNVar6;
  byte bVar7;
  pointer pNVar8;
  uint uVar9;
  int iVar10;
  SmartDigraph *pSVar11;
  size_type __n;
  long lVar12;
  ulong uVar13;
  pointer pNVar14;
  ulong uVar15;
  int iVar16;
  long lVar17;
  iterator iVar18;
  pointer pNVar19;
  double dVar20;
  Node target;
  vector<lemon::SmartDigraphBase::Node,_std::allocator<lemon::SmartDigraphBase::Node>_> nextProcess;
  vector<double,_std::allocator<double>_> values;
  Node local_6c;
  pointer local_68;
  iterator iStack_60;
  pointer local_58;
  vector<double,_std::allocator<double>_> local_48;
  
  pNVar14 = (this->_process).
            super__Vector_base<lemon::SmartDigraphBase::Node,_std::allocator<lemon::SmartDigraphBase::Node>_>
            ._M_impl.super__Vector_impl_data._M_start;
  __n = (long)(this->_process).
              super__Vector_base<lemon::SmartDigraphBase::Node,_std::allocator<lemon::SmartDigraphBase::Node>_>
              ._M_impl.super__Vector_impl_data._M_finish - (long)pNVar14 >> 2;
  uVar9 = (uint)__n;
  if (0 < (int)uVar9) {
    p_Var2 = (this->_mask->super_NodeMap<bool>).
             super_MapExtender<lemon::DefaultMap<lemon::DigraphExtender<lemon::SmartDigraphBase>,_lemon::SmartDigraphBase::Node,_bool>_>
             .
             super_DefaultMap<lemon::DigraphExtender<lemon::SmartDigraphBase>,_lemon::SmartDigraphBase::Node,_bool>
             .super_Map.container.super__Bvector_base<std::allocator<bool>_>._M_impl.
             super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p;
    uVar15 = 0;
    do {
      iVar10 = pNVar14[uVar15]._id;
      iVar16 = iVar10 + 0x3f;
      if (-1 < (long)iVar10) {
        iVar16 = iVar10;
      }
      bVar7 = (byte)iVar10 & 0x3f;
      puVar1 = p_Var2 + (long)(iVar16 >> 6) +
                        (ulong)(((long)iVar10 & 0x800000000000003fU) < 0x8000000000000001) +
                        0xffffffffffffffff;
      *puVar1 = *puVar1 & (-2L << bVar7 | 0xfffffffffffffffeU >> 0x40 - bVar7);
      uVar15 = uVar15 + 1;
    } while ((uVar9 & 0x7fffffff) != uVar15);
  }
  local_68 = (pointer)0x0;
  iStack_60._M_current = (pointer)0x0;
  local_58 = (pointer)0x0;
  std::vector<double,_std::allocator<double>_>::vector(&local_48,__n,(allocator_type *)&local_6c);
  pNVar14 = (this->_process).
            super__Vector_base<lemon::SmartDigraphBase::Node,_std::allocator<lemon::SmartDigraphBase::Node>_>
            ._M_impl.super__Vector_impl_data._M_start;
  pNVar8 = (this->_process).
           super__Vector_base<lemon::SmartDigraphBase::Node,_std::allocator<lemon::SmartDigraphBase::Node>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  uVar9 = (uint)((ulong)((long)pNVar8 - (long)pNVar14) >> 2);
  if (0 < (int)uVar9) {
    pdVar3 = (this->_dist->super_NodeMap<double>).
             super_MapExtender<lemon::DefaultMap<lemon::DigraphExtender<lemon::SmartDigraphBase>,_lemon::SmartDigraphBase::Node,_double>_>
             .
             super_DefaultMap<lemon::DigraphExtender<lemon::SmartDigraphBase>,_lemon::SmartDigraphBase::Node,_double>
             .super_Map.container.super__Vector_base<double,_std::allocator<double>_>._M_impl.
             super__Vector_impl_data._M_start;
    uVar15 = 0;
    do {
      local_48.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
      _M_start[uVar15] = pdVar3[pNVar14[uVar15]._id];
      uVar15 = uVar15 + 1;
    } while ((uVar9 & 0x7fffffff) != uVar15);
    if (0 < (int)uVar9) {
      lVar17 = 0;
      do {
        pDVar4 = this->_gr;
        pSVar11 = (pDVar4->
                  super_DigraphAdaptorExtender<lemon::ReverseDigraphBase<const_lemon::SmartDigraph>_>
                  ).super_ReverseDigraphBase<const_lemon::SmartDigraph>.
                  super_DigraphAdaptorBase<const_lemon::SmartDigraph>._digraph;
        iVar10 = *(int *)(*(long *)&(pSVar11->super_ExtendedSmartDigraphBase).super_SmartDigraphBase
                                    ._nodes + (long)pNVar14[lVar17]._id * 8);
        if (iVar10 != -1) {
          do {
            lVar12 = (long)iVar10;
            local_6c._id = *(int *)(*(long *)&(((this->_gr->
                                                super_DigraphAdaptorExtender<lemon::ReverseDigraphBase<const_lemon::SmartDigraph>_>
                                                ).
                                                super_ReverseDigraphBase<const_lemon::SmartDigraph>.
                                                super_DigraphAdaptorBase<const_lemon::SmartDigraph>.
                                               _digraph)->super_ExtendedSmartDigraphBase).
                                              super_SmartDigraphBase._arcs.
                                              super__Vector_base<lemon::SmartDigraphBase::ArcT,_std::allocator<lemon::SmartDigraphBase::ArcT>_>
                                              ._M_impl.super__Vector_impl_data + 4 + lVar12 * 0x10);
            dVar20 = local_48.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                     super__Vector_impl_data._M_start[lVar17] +
                     (this->_length->
                     super_MapExtender<lemon::DefaultMap<lemon::DigraphExtender<lemon::SmartDigraphBase>,_lemon::SmartDigraphBase::Arc,_double>_>
                     ).
                     super_DefaultMap<lemon::DigraphExtender<lemon::SmartDigraphBase>,_lemon::SmartDigraphBase::Arc,_double>
                     .super_Map.container.super__Vector_base<double,_std::allocator<double>_>.
                     _M_impl.super__Vector_impl_data._M_start[lVar12];
            pdVar3 = (this->_dist->super_NodeMap<double>).
                     super_MapExtender<lemon::DefaultMap<lemon::DigraphExtender<lemon::SmartDigraphBase>,_lemon::SmartDigraphBase::Node,_double>_>
                     .
                     super_DefaultMap<lemon::DigraphExtender<lemon::SmartDigraphBase>,_lemon::SmartDigraphBase::Node,_double>
                     .super_Map.container.super__Vector_base<double,_std::allocator<double>_>.
                     _M_impl.super__Vector_impl_data._M_start;
            if (dVar20 < pdVar3[local_6c._id]) {
              (this->_pred->super_NodeMap<lemon::SmartDigraphBase::Arc>).
              super_MapExtender<lemon::DefaultMap<lemon::DigraphExtender<lemon::SmartDigraphBase>,_lemon::SmartDigraphBase::Node,_lemon::SmartDigraphBase::Arc>_>
              .
              super_DefaultMap<lemon::DigraphExtender<lemon::SmartDigraphBase>,_lemon::SmartDigraphBase::Node,_lemon::SmartDigraphBase::Arc>
              .super_Map.values[local_6c._id]._id = iVar10;
              uVar15 = (ulong)local_6c._id;
              pdVar3[uVar15] = dVar20;
              iVar10 = local_6c._id + 0x3f;
              if (-1 < (long)uVar15) {
                iVar10 = local_6c._id;
              }
              p_Var2 = (this->_mask->super_NodeMap<bool>).
                       super_MapExtender<lemon::DefaultMap<lemon::DigraphExtender<lemon::SmartDigraphBase>,_lemon::SmartDigraphBase::Node,_bool>_>
                       .
                       super_DefaultMap<lemon::DigraphExtender<lemon::SmartDigraphBase>,_lemon::SmartDigraphBase::Node,_bool>
                       .super_Map.container.super__Bvector_base<std::allocator<bool>_>._M_impl.
                       super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p;
              uVar13 = (ulong)((uVar15 & 0x800000000000003f) < 0x8000000000000001);
              uVar5 = p_Var2[(long)(iVar10 >> 6) + uVar13 + 0xffffffffffffffff];
              if ((uVar5 >> (uVar15 & 0x3f) & 1) == 0) {
                p_Var2[(long)(iVar10 >> 6) + uVar13 + 0xffffffffffffffff] =
                     uVar5 | 1L << ((byte)local_6c._id & 0x3f);
                if (iStack_60._M_current == local_58) {
                  std::
                  vector<lemon::SmartDigraphBase::Node,std::allocator<lemon::SmartDigraphBase::Node>>
                  ::_M_realloc_insert<lemon::SmartDigraphBase::Node_const&>
                            ((vector<lemon::SmartDigraphBase::Node,std::allocator<lemon::SmartDigraphBase::Node>>
                              *)&local_68,iStack_60,&local_6c);
                  pSVar11 = (pDVar4->
                            super_DigraphAdaptorExtender<lemon::ReverseDigraphBase<const_lemon::SmartDigraph>_>
                            ).super_ReverseDigraphBase<const_lemon::SmartDigraph>.
                            super_DigraphAdaptorBase<const_lemon::SmartDigraph>._digraph;
                }
                else {
                  (iStack_60._M_current)->_id = local_6c._id;
                  iStack_60._M_current = iStack_60._M_current + 1;
                }
              }
            }
            iVar10 = *(int *)((long)((pSVar11->super_ExtendedSmartDigraphBase).
                                     super_SmartDigraphBase._arcs.
                                     super__Vector_base<lemon::SmartDigraphBase::ArcT,_std::allocator<lemon::SmartDigraphBase::ArcT>_>
                                     ._M_impl.super__Vector_impl_data._M_start + lVar12) + 8);
          } while (iVar10 != -1);
          pNVar14 = (this->_process).
                    super__Vector_base<lemon::SmartDigraphBase::Node,_std::allocator<lemon::SmartDigraphBase::Node>_>
                    ._M_impl.super__Vector_impl_data._M_start;
          pNVar8 = (this->_process).
                   super__Vector_base<lemon::SmartDigraphBase::Node,_std::allocator<lemon::SmartDigraphBase::Node>_>
                   ._M_impl.super__Vector_impl_data._M_finish;
        }
        lVar17 = lVar17 + 1;
        iVar18._M_current = (Node *)iStack_60;
        pNVar19 = local_68;
      } while (lVar17 < (int)((ulong)((long)pNVar8 - (long)pNVar14) >> 2));
      goto LAB_001598da;
    }
  }
  local_58 = (pointer)0x0;
  iVar18._M_current = (pointer)0x0;
  pNVar19 = (pointer)0x0;
LAB_001598da:
  pNVar6 = (this->_process).
           super__Vector_base<lemon::SmartDigraphBase::Node,_std::allocator<lemon::SmartDigraphBase::Node>_>
           ._M_impl.super__Vector_impl_data._M_end_of_storage;
  (this->_process).
  super__Vector_base<lemon::SmartDigraphBase::Node,_std::allocator<lemon::SmartDigraphBase::Node>_>.
  _M_impl.super__Vector_impl_data._M_start = pNVar19;
  (this->_process).
  super__Vector_base<lemon::SmartDigraphBase::Node,_std::allocator<lemon::SmartDigraphBase::Node>_>.
  _M_impl.super__Vector_impl_data._M_finish = iVar18._M_current;
  (this->_process).
  super__Vector_base<lemon::SmartDigraphBase::Node,_std::allocator<lemon::SmartDigraphBase::Node>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = local_58;
  local_68 = pNVar14;
  iStack_60._M_current = pNVar8;
  local_58 = pNVar6;
  if (local_48.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
      _M_start != (pointer)0x0) {
    operator_delete(local_48.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_48.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_48.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  if (local_68 != (pointer)0x0) {
    operator_delete(local_68,(long)local_58 - (long)local_68);
  }
  return pNVar19 == iVar18._M_current;
}

Assistant:

bool processNextRound() {
    for (int i = 0; i < int(_process.size()); ++i) {
      _mask->set(_process[i], false);
    }
    std::vector<Node>  nextProcess;
    std::vector<Value> values(_process.size());
    for (int i = 0; i < int(_process.size()); ++i) {
      values[i] = (*_dist)[_process[i]];
    }
    for (int i = 0; i < int(_process.size()); ++i) {
      for (OutArcIt it(*_gr, _process[i]); it != INVALID; ++it) {
        Node  target  = _gr->target(it);
        Value relaxed = OperationTraits::plus(values[i], (*_length)[it]);
        if (OperationTraits::less(relaxed, (*_dist)[target])) {
          _pred->set(target, it);
          _dist->set(target, relaxed);
          if (!(*_mask)[target]) {
            _mask->set(target, true);
            nextProcess.push_back(target);
          }
        }
      }
    }
    _process.swap(nextProcess);
    return _process.empty();
  }